

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNavID(ImGuiID id,ImGuiNavLayer nav_layer,ImGuiID focus_scope_id,ImRect *rect_rel)

{
  ImGuiContext *pIVar1;
  ImVec2 *pIVar2;
  bool local_29;
  ImGuiContext *g;
  ImRect *rect_rel_local;
  ImGuiID focus_scope_id_local;
  ImGuiNavLayer nav_layer_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindow != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x2583,"void ImGui::SetNavID(ImGuiID, ImGuiNavLayer, ImGuiID, const ImRect &)");
  }
  local_29 = ImGuiNavLayer_Menu < nav_layer;
  if (local_29) {
    __assert_fail("nav_layer == ImGuiNavLayer_Main || nav_layer == ImGuiNavLayer_Menu",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x2584,"void ImGui::SetNavID(ImGuiID, ImGuiNavLayer, ImGuiID, const ImRect &)");
  }
  GImGui->NavId = id;
  pIVar1->NavLayer = nav_layer;
  pIVar1->NavFocusScopeId = focus_scope_id;
  pIVar1->NavWindow->NavLastIds[nav_layer] = id;
  pIVar2 = &pIVar1->NavWindow->NavRectRel[nav_layer].Min;
  *pIVar2 = rect_rel->Min;
  pIVar2[1] = rect_rel->Max;
  return;
}

Assistant:

void ImGui::SetNavID(ImGuiID id, ImGuiNavLayer nav_layer, ImGuiID focus_scope_id, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow != NULL);
    IM_ASSERT(nav_layer == ImGuiNavLayer_Main || nav_layer == ImGuiNavLayer_Menu);
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = focus_scope_id;
    g.NavWindow->NavLastIds[nav_layer] = id;
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;
}